

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O3

void __thiscall SQSharedState::~SQSharedState(SQSharedState *this)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQObjectPtr *pSVar4;
  SQObjectPtrVec *pSVar5;
  SQCollectable_conflict *pSVar6;
  SQCollectable_conflict *pSVar7;
  SQUnsignedInteger SVar8;
  
  if (this->_releasehook != (SQRELEASEHOOK)0x0) {
    (*this->_releasehook)(this->_foreignptr,0);
    this->_releasehook = (SQRELEASEHOOK)0x0;
  }
  pSVar3 = (this->_constructoridx).super_SQObject._unVal.pTable;
  SVar2 = (this->_constructoridx).super_SQObject._type;
  (this->_constructoridx).super_SQObject._type = OT_NULL;
  (this->_constructoridx).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  (*(((this->_registry).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
    super_SQRefCounted._vptr_SQRefCounted[5])();
  (*(((this->_consts).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
    super_SQRefCounted._vptr_SQRefCounted[5])();
  (*(((this->_metamethodsmap).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
    super_SQRefCounted._vptr_SQRefCounted[5])();
  pSVar3 = (this->_registry).super_SQObject._unVal.pTable;
  SVar2 = (this->_registry).super_SQObject._type;
  (this->_registry).super_SQObject._type = OT_NULL;
  (this->_registry).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar3 = (this->_consts).super_SQObject._unVal.pTable;
  SVar2 = (this->_consts).super_SQObject._type;
  (this->_consts).super_SQObject._type = OT_NULL;
  (this->_consts).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar3 = (this->_metamethodsmap).super_SQObject._unVal.pTable;
  SVar2 = (this->_metamethodsmap).super_SQObject._type;
  (this->_metamethodsmap).super_SQObject._type = OT_NULL;
  (this->_metamethodsmap).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  while( true ) {
    SVar8 = this->_systemstrings->_size;
    if (SVar8 == 0) break;
    pSVar4 = this->_systemstrings->_vals;
    pSVar3 = pSVar4[SVar8 - 1].super_SQObject._unVal.pTable;
    SVar2 = pSVar4[SVar8 - 1].super_SQObject._type;
    pSVar4[SVar8 - 1].super_SQObject._type = OT_NULL;
    pSVar4[SVar8 - 1].super_SQObject._unVal.pTable = (SQTable *)0x0;
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    pSVar5 = this->_systemstrings;
    SVar8 = pSVar5->_size - 1;
    pSVar5->_size = SVar8;
    SQObjectPtr::~SQObjectPtr(pSVar5->_vals + SVar8);
  }
  (*(((this->_root_vm).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
    super_SQRefCounted._vptr_SQRefCounted[5])();
  pSVar3 = (this->_root_vm).super_SQObject._unVal.pTable;
  SVar2 = (this->_root_vm).super_SQObject._type;
  (this->_root_vm).super_SQObject._type = OT_NULL;
  (this->_root_vm).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar3 = (this->_table_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_table_default_delegate).super_SQObject._type;
  (this->_table_default_delegate).super_SQObject._type = OT_NULL;
  (this->_table_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar3 = (this->_array_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_array_default_delegate).super_SQObject._type;
  (this->_array_default_delegate).super_SQObject._type = OT_NULL;
  (this->_array_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar3 = (this->_string_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_string_default_delegate).super_SQObject._type;
  (this->_string_default_delegate).super_SQObject._type = OT_NULL;
  (this->_string_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar3 = (this->_number_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_number_default_delegate).super_SQObject._type;
  (this->_number_default_delegate).super_SQObject._type = OT_NULL;
  (this->_number_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar3 = (this->_closure_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_closure_default_delegate).super_SQObject._type;
  (this->_closure_default_delegate).super_SQObject._type = OT_NULL;
  (this->_closure_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar3 = (this->_generator_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_generator_default_delegate).super_SQObject._type;
  (this->_generator_default_delegate).super_SQObject._type = OT_NULL;
  (this->_generator_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar3 = (this->_thread_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_thread_default_delegate).super_SQObject._type;
  (this->_thread_default_delegate).super_SQObject._type = OT_NULL;
  (this->_thread_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar3 = (this->_class_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_class_default_delegate).super_SQObject._type;
  (this->_class_default_delegate).super_SQObject._type = OT_NULL;
  (this->_class_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar3 = (this->_instance_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_instance_default_delegate).super_SQObject._type;
  (this->_instance_default_delegate).super_SQObject._type = OT_NULL;
  (this->_instance_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar3 = (this->_weakref_default_delegate).super_SQObject._unVal.pTable;
  SVar2 = (this->_weakref_default_delegate).super_SQObject._type;
  (this->_weakref_default_delegate).super_SQObject._type = OT_NULL;
  (this->_weakref_default_delegate).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  RefTable::Finalize(&this->_refs_table);
  pSVar7 = this->_gc_chain;
  if (pSVar7 != (SQCollectable_conflict *)0x0) {
    pSVar1 = &(pSVar7->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
    do {
      (*(pSVar7->super_SQRefCounted)._vptr_SQRefCounted[5])(pSVar7);
      pSVar6 = pSVar7->_next;
      if (pSVar6 != (SQCollectable_conflict *)0x0) {
        pSVar1 = &(pSVar6->super_SQRefCounted)._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      pSVar1 = &(pSVar7->super_SQRefCounted)._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar7->super_SQRefCounted)._vptr_SQRefCounted[2])(pSVar7);
      }
      pSVar7 = pSVar6;
    } while (pSVar6 != (SQCollectable_conflict *)0x0);
    if (this->_gc_chain != (SQCollectable_conflict *)0x0) {
      __assert_fail("_gc_chain==NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqstate.cpp"
                    ,0xc6,"SQSharedState::~SQSharedState()");
    }
  }
  while (pSVar7 = this->_gc_chain, pSVar7 != (SQCollectable_conflict *)0x0) {
    pSVar1 = &(pSVar7->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
    (*(pSVar7->super_SQRefCounted)._vptr_SQRefCounted[2])();
  }
  sqvector<SQObjectPtr>::~sqvector(this->_types);
  sq_vm_free(this->_types,0x18);
  sqvector<SQObjectPtr>::~sqvector(this->_systemstrings);
  sq_vm_free(this->_systemstrings,0x18);
  sqvector<SQObjectPtr>::~sqvector(this->_metamethods);
  sq_vm_free(this->_metamethods,0x18);
  SQStringTable::~SQStringTable(this->_stringtable);
  sq_vm_free(this->_stringtable,0x20);
  if (this->_scratchpad != (SQChar *)0x0) {
    sq_vm_free(this->_scratchpad,this->_scratchpadsize);
  }
  SQObjectPtr::~SQObjectPtr(&this->_weakref_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_instance_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_class_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_thread_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_closure_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_generator_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_number_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_string_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_array_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_table_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_root_vm);
  SQObjectPtr::~SQObjectPtr(&this->_constructoridx);
  SQObjectPtr::~SQObjectPtr(&this->_consts);
  SQObjectPtr::~SQObjectPtr(&this->_registry);
  RefTable::~RefTable(&this->_refs_table);
  SQObjectPtr::~SQObjectPtr(&this->_metamethodsmap);
  return;
}

Assistant:

SQSharedState::~SQSharedState()
{
    if(_releasehook) { _releasehook(_foreignptr,0); _releasehook = NULL; }
    _constructoridx.Null();
    _table(_registry)->Finalize();
    _table(_consts)->Finalize();
    _table(_metamethodsmap)->Finalize();
    _registry.Null();
    _consts.Null();
    _metamethodsmap.Null();
    while(!_systemstrings->empty()) {
        _systemstrings->back().Null();
        _systemstrings->pop_back();
    }
    _thread(_root_vm)->Finalize();
    _root_vm.Null();
    _table_default_delegate.Null();
    _array_default_delegate.Null();
    _string_default_delegate.Null();
    _number_default_delegate.Null();
    _closure_default_delegate.Null();
    _generator_default_delegate.Null();
    _thread_default_delegate.Null();
    _class_default_delegate.Null();
    _instance_default_delegate.Null();
    _weakref_default_delegate.Null();
    _refs_table.Finalize();
#ifndef NO_GARBAGE_COLLECTOR
    SQCollectable *t = _gc_chain;
    SQCollectable *nx = NULL;
    if(t) {
        t->_uiRef++;
        while(t) {
            t->Finalize();
            nx = t->_next;
            if(nx) nx->_uiRef++;
            if(--t->_uiRef == 0)
                t->Release();
            t = nx;
        }
    }
    assert(_gc_chain==NULL); //just to proove a theory
    while(_gc_chain){
        _gc_chain->_uiRef++;
        _gc_chain->Release();
    }
#endif

    sq_delete(_types,SQObjectPtrVec);
    sq_delete(_systemstrings,SQObjectPtrVec);
    sq_delete(_metamethods,SQObjectPtrVec);
    sq_delete(_stringtable,SQStringTable);
    if(_scratchpad)SQ_FREE(_scratchpad,_scratchpadsize);
}